

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

void __thiscall FIX::Header::Header(Header *this)

{
  message_order local_30;
  Header *local_10;
  Header *this_local;
  
  local_10 = this;
  message_order::message_order(&local_30,header);
  FIX::FieldMap::FieldMap(&this->super_FieldMap,&local_30,8);
  message_order::~message_order(&local_30);
  *(undefined ***)this = &PTR__Header_0045d7c0;
  return;
}

Assistant:

Header() : FieldMap( message_order( message_order::header ), REQUIRED_FIELDS )
  {}